

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetLocalizedGMT
          (TimeZoneFormat *this,UnicodeString *text,ParsePosition *pos,UBool isShort,
          UBool *hasDigitOffset)

{
  short sVar1;
  int start;
  int8_t iVar2;
  uint in_EAX;
  int32_t iVar3;
  int iVar4;
  long lVar5;
  int32_t parsedLength;
  undefined8 uStack_38;
  
  start = pos->index;
  uStack_38 = (ulong)in_EAX;
  if (hasDigitOffset != (UBool *)0x0) {
    *hasDigitOffset = '\0';
  }
  iVar3 = parseOffsetLocalizedGMTPattern(this,text,start,'\0',(int32_t *)((long)&uStack_38 + 4));
  if (uStack_38._4_4_ < 1) {
    iVar3 = parseOffsetDefaultLocalizedGMT(this,text,start,(int32_t *)((long)&uStack_38 + 4));
    if (uStack_38._4_4_ < 1) {
      sVar1 = (this->fGMTZeroFormat).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar3 = (this->fGMTZeroFormat).fUnion.fFields.fLength;
      }
      else {
        iVar3 = (int)sVar1 >> 5;
      }
      iVar2 = UnicodeString::caseCompare(text,start,iVar3,&this->fGMTZeroFormat,0);
      if (iVar2 == '\0') {
        sVar1 = (this->fGMTZeroFormat).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar4 = (this->fGMTZeroFormat).fUnion.fFields.fLength;
        }
        else {
          iVar4 = (int)sVar1 >> 5;
        }
        pos->index = iVar4 + start;
      }
      else {
        lVar5 = 0;
        do {
          if (lVar5 + 8 == 0x20) {
            pos->errorIndex = start;
            return 0;
          }
          iVar3 = u_strlen_63((UChar *)(ALT_GMT_STRINGS + lVar5));
          iVar2 = UnicodeString::caseCompare
                            (text,start,iVar3,(char16_t *)(ALT_GMT_STRINGS + lVar5),0);
          lVar5 = lVar5 + 8;
        } while (iVar2 != '\0');
        pos->index = iVar3 + start;
      }
      return 0;
    }
  }
  if (hasDigitOffset != (UBool *)0x0) {
    *hasDigitOffset = '\x01';
  }
  pos->index = uStack_38._4_4_ + start;
  return iVar3;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetLocalizedGMT(const UnicodeString& text, ParsePosition& pos, UBool isShort, UBool* hasDigitOffset) const {
    int32_t start = pos.getIndex();
    int32_t offset = 0;
    int32_t parsedLength = 0;

    if (hasDigitOffset) {
        *hasDigitOffset = FALSE;
    }

    offset = parseOffsetLocalizedGMTPattern(text, start, isShort, parsedLength);

    // For now, parseOffsetLocalizedGMTPattern handles both long and short
    // formats, no matter isShort is true or false. This might be changed in future
    // when strict parsing is necessary, or different set of patterns are used for
    // short/long formats.
#if 0
    if (parsedLength == 0) {
        offset = parseOffsetLocalizedGMTPattern(text, start, !isShort, parsedLength);
    }
#endif

    if (parsedLength > 0) {
        if (hasDigitOffset) {
            *hasDigitOffset = TRUE;
        }
        pos.setIndex(start + parsedLength);
        return offset;
    }

    // Try the default patterns
    offset = parseOffsetDefaultLocalizedGMT(text, start, parsedLength);
    if (parsedLength > 0) {
        if (hasDigitOffset) {
            *hasDigitOffset = TRUE;
        }
        pos.setIndex(start + parsedLength);
        return offset;
    }

    // Check if this is a GMT zero format
    if (text.caseCompare(start, fGMTZeroFormat.length(), fGMTZeroFormat, 0) == 0) {
        pos.setIndex(start + fGMTZeroFormat.length());
        return 0;
    }

    // Check if this is a default GMT zero format
    for (int32_t i = 0; ALT_GMT_STRINGS[i][0] != 0; i++) {
        const UChar* defGMTZero = ALT_GMT_STRINGS[i];
        int32_t defGMTZeroLen = u_strlen(defGMTZero);
        if (text.caseCompare(start, defGMTZeroLen, defGMTZero, 0) == 0) {
            pos.setIndex(start + defGMTZeroLen);
            return 0;
        }
    }

    // Nothing matched
    pos.setErrorIndex(start);
    return 0;
}